

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art_internal_impl.hpp
# Opt level: O0

node_ptr __thiscall
unodb::detail::
basic_inode_48<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
::get_child(basic_inode_48<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
            *this,uint8_t child_index)

{
  byte bVar1;
  reference this_00;
  reference this_01;
  uchar child_i;
  uint8_t child_index_local;
  basic_inode_48<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
  *this_local;
  
  this_00 = std::array<unodb::in_critical_section<unsigned_char>,_256UL>::operator[]
                      (&this->child_indexes,(ulong)child_index);
  bVar1 = in_critical_section<unsigned_char>::load(this_00);
  if (bVar1 == 0xff) {
    memset(&this_local,0,8);
  }
  else {
    this_01 = std::
              array<unodb::in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>,_48UL>
              ::operator[](&(this->children).pointer_array,(ulong)bVar1);
    this_local = (basic_inode_48<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
                  *)in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>
                    ::load(this_01);
  }
  return (node_ptr)(uintptr_t)this_local;
}

Assistant:

[[nodiscard, gnu::pure]] constexpr node_ptr get_child(
      std::uint8_t child_index) noexcept {
    const auto child_i = child_indexes[child_index].load();
    // In a data race, the child_indices[] can be concurrently
    // modified, which will cause the OLC version tag to get
    // bumped. However, we are in the middle of reading and acting on
    // the data while that happens.  This can cause the value stored
    // in child_indices[] at our desired child_index to be empty_child
    // (0xFF).  In this circumstance, the caller will correctly detect
    // a problem when they do read_critical_section::check(), but we
    // will have still indirected beyond the end of the allocation and
    // ASAN can fail us.  To prevent that and read only the data that
    // is legally allocated to the node, we return nullptr in this
    // case and rely on the caller to detect a problem when they call
    // read_critical_section::check().
    return UNODB_DETAIL_UNLIKELY(child_i == empty_child)
               ? node_ptr()  // aka nullptr
               : children.pointer_array[child_i].load();
  }